

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixMainParameters.cpp
# Opt level: O2

void fixMainParameters(Module *module,Program *program)

{
  Value *pVVar1;
  bool bVar2;
  Type *type;
  Func *pFVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  Module *f;
  Module *pMVar6;
  StringRef LHS;
  StringRef RHS;
  allocator local_59;
  Type *local_58;
  string local_50 [32];
  
  type = TypeHandler::pointerTo
                   (&program->typeHandler,
                    (Type *)(program->typeHandler).schar._M_t.
                            super___uniq_ptr_impl<CharType,_std::default_delete<CharType>_>._M_t.
                            super__Tuple_impl<0UL,_CharType_*,_std::default_delete<CharType>_>.
                            super__Head_base<0UL,_CharType_*,_false>._M_head_impl);
  local_58 = TypeHandler::pointerTo(&program->typeHandler,type);
  for (pMVar6 = module + 0x20; pMVar6 = *(Module **)pMVar6, pMVar6 != module + 0x18;
      pMVar6 = pMVar6 + 8) {
    f = pMVar6 + -0x38;
    if (pMVar6 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    LHS = (StringRef)llvm::Value::getName();
    RHS.Length = 4;
    RHS.Data = "main";
    bVar2 = llvm::operator!=(LHS,RHS);
    if (!bVar2) {
      pFVar3 = Program::getFunction(program,(Function *)f);
      if (*(char *)(**(long **)(*(long *)((Function *)f + 0x18) + 0x10) + 8) == '\r') {
        pFVar3->returnType =
             (Type *)(program->typeHandler).sint._M_t.
                     super___uniq_ptr_impl<IntType,_std::default_delete<IntType>_>._M_t.
                     super__Tuple_impl<0UL,_IntType_*,_std::default_delete<IntType>_>.
                     super__Head_base<0UL,_IntType_*,_false>._M_head_impl;
      }
      ppVVar4 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar5 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppVVar5 != ppVVar4) {
        (*((*ppVVar4)->super_ExprBase).super_Expr._vptr_Expr[5])
                  (*ppVVar4,(program->typeHandler).sint._M_t.
                            super___uniq_ptr_impl<IntType,_std::default_delete<IntType>_>._M_t.
                            super__Tuple_impl<0UL,_IntType_*,_std::default_delete<IntType>_>.
                            super__Head_base<0UL,_IntType_*,_false>._M_head_impl);
        pVVar1 = *(pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        std::__cxx11::string::string(local_50,"argc",&local_59);
        std::__cxx11::string::_M_assign((string *)&pVVar1->valueName);
        std::__cxx11::string::~string(local_50);
        ppVVar4 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        ppVVar5 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      }
      if (8 < (ulong)((long)ppVVar5 - (long)ppVVar4)) {
        (*(ppVVar4[1]->super_ExprBase).super_Expr._vptr_Expr[5])(ppVVar4[1],local_58);
        pVVar1 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
        std::__cxx11::string::string(local_50,"argv",&local_59);
        std::__cxx11::string::_M_assign((string *)&pVVar1->valueName);
        std::__cxx11::string::~string(local_50);
      }
    }
  }
  Program::addPass(program,FixMainParameters);
  return;
}

Assistant:

void fixMainParameters(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctionParameters));

    auto* uchar_ptr_ptr = program.typeHandler.pointerTo(program.typeHandler.pointerTo(program.typeHandler.schar.get()));

    for (const llvm::Function& func : module->functions()) {
        if (func.getName() != "main") {
            continue;
        }

        auto* myFunc = program.getFunction(&func);

        if (func.getReturnType()->isIntegerTy())
            myFunc->returnType = program.typeHandler.sint.get();

        if (myFunc->parameters.size() >= 1) {
            myFunc->parameters[0]->setType(program.typeHandler.sint.get());
            myFunc->parameters[0]->setName("argc");
        }

        if (myFunc->parameters.size() >= 2) {
            myFunc->parameters[1]->setType(uchar_ptr_ptr);
            myFunc->parameters[1]->setName("argv");
        }

    }

    program.addPass(PassType::FixMainParameters);
}